

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O0

ares_conn_err_t ares_socket_deref_error(int err)

{
  ares_conn_err_t local_c;
  int err_local;
  
  switch(err) {
  case 4:
    local_c = ARES_CONN_ERR_INTERRUPT;
    break;
  default:
    local_c = ARES_CONN_ERR_FAILURE;
    break;
  case 0xb:
    local_c = ARES_CONN_ERR_WOULDBLOCK;
    break;
  case 0x61:
    local_c = ARES_CONN_ERR_AFNOSUPPORT;
    break;
  case 99:
    local_c = ARES_CONN_ERR_BADADDR;
    break;
  case 100:
    local_c = ARES_CONN_ERR_NETDOWN;
    break;
  case 0x65:
    local_c = ARES_CONN_ERR_NETUNREACH;
    break;
  case 0x67:
    local_c = ARES_CONN_ERR_CONNABORTED;
    break;
  case 0x68:
    local_c = ARES_CONN_ERR_CONNRESET;
    break;
  case 0x6e:
    local_c = ARES_CONN_ERR_CONNTIMEDOUT;
    break;
  case 0x6f:
    local_c = ARES_CONN_ERR_CONNREFUSED;
    break;
  case 0x70:
    local_c = ARES_CONN_ERR_HOSTDOWN;
    break;
  case 0x71:
    local_c = ARES_CONN_ERR_HOSTUNREACH;
    break;
  case 0x73:
    local_c = ARES_CONN_ERR_WOULDBLOCK;
  }
  return local_c;
}

Assistant:

static ares_conn_err_t ares_socket_deref_error(int err)
{
  switch (err) {
#if defined(EWOULDBLOCK)
    case EWOULDBLOCK:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
#if defined(EAGAIN) && (!defined(EWOULDBLOCK) || EAGAIN != EWOULDBLOCK)
    case EAGAIN:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
    case EINPROGRESS:
      return ARES_CONN_ERR_WOULDBLOCK;
    case ENETDOWN:
      return ARES_CONN_ERR_NETDOWN;
    case ENETUNREACH:
      return ARES_CONN_ERR_NETUNREACH;
    case ECONNABORTED:
      return ARES_CONN_ERR_CONNABORTED;
    case ECONNRESET:
      return ARES_CONN_ERR_CONNRESET;
    case ECONNREFUSED:
      return ARES_CONN_ERR_CONNREFUSED;
    case ETIMEDOUT:
      return ARES_CONN_ERR_CONNTIMEDOUT;
    case EHOSTDOWN:
      return ARES_CONN_ERR_HOSTDOWN;
    case EHOSTUNREACH:
      return ARES_CONN_ERR_HOSTUNREACH;
    case EINTR:
      return ARES_CONN_ERR_INTERRUPT;
    case EAFNOSUPPORT:
      return ARES_CONN_ERR_AFNOSUPPORT;
    case EADDRNOTAVAIL:
      return ARES_CONN_ERR_BADADDR;
    default:
      break;
  }

  return ARES_CONN_ERR_FAILURE;
}